

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O2

float ncnn::reduction(float v0,float *ptr,int size,int stride,int op_type)

{
  int iVar1;
  float fVar2;
  float local_28;
  
  switch(op_type) {
  case 0:
    iVar1 = 0;
    if (0 < size) {
      iVar1 = size;
    }
    while (iVar1 != 0) {
      v0 = v0 + *ptr;
      ptr = ptr + stride;
      iVar1 = iVar1 + -1;
    }
    break;
  case 1:
    iVar1 = 0;
    if (0 < size) {
      iVar1 = size;
    }
    while (iVar1 != 0) {
      v0 = v0 + ABS(*ptr);
      ptr = ptr + stride;
      iVar1 = iVar1 + -1;
    }
    break;
  case 2:
    iVar1 = 0;
    if (0 < size) {
      iVar1 = size;
    }
    while (iVar1 != 0) {
      v0 = v0 + *ptr * *ptr;
      ptr = ptr + stride;
      iVar1 = iVar1 + -1;
    }
    break;
  case 3:
  case 7:
  case 8:
  case 9:
    break;
  case 4:
    iVar1 = 0;
    if (0 < size) {
      iVar1 = size;
    }
    while (iVar1 != 0) {
      if (v0 <= *ptr) {
        v0 = *ptr;
      }
      ptr = ptr + stride;
      iVar1 = iVar1 + -1;
    }
    break;
  case 5:
    iVar1 = 0;
    if (0 < size) {
      iVar1 = size;
    }
    while (iVar1 != 0) {
      if (*ptr <= v0) {
        v0 = *ptr;
      }
      ptr = ptr + stride;
      iVar1 = iVar1 + -1;
    }
    break;
  case 6:
    iVar1 = 0;
    if (0 < size) {
      iVar1 = size;
    }
    while (iVar1 != 0) {
      v0 = v0 * *ptr;
      ptr = ptr + stride;
      iVar1 = iVar1 + -1;
    }
    break;
  case 10:
    iVar1 = 0;
    local_28 = v0;
    if (0 < size) {
      iVar1 = size;
    }
    while (v0 = local_28, iVar1 != 0) {
      fVar2 = expf(*ptr);
      local_28 = local_28 + fVar2;
      ptr = ptr + stride;
      iVar1 = iVar1 + -1;
    }
    break;
  default:
    goto switchD_002f90d0_default;
  }
switchD_002f90d0_default:
  return v0;
}

Assistant:

static float reduction(float v0, const float* ptr, int size, int stride, int op_type)
{
    if (op_type == Reduction::ReductionOp_SUM) return reduction<reduction_op_add>(v0, ptr, size, stride);
    if (op_type == Reduction::ReductionOp_ASUM) return reduction<reduction_op_asum>(v0, ptr, size, stride);
    if (op_type == Reduction::ReductionOp_SUMSQ) return reduction<reduction_op_sumsq>(v0, ptr, size, stride);
    if (op_type == Reduction::ReductionOp_PROD) return reduction<reduction_op_mul>(v0, ptr, size, stride);
    if (op_type == Reduction::ReductionOp_MAX) return reduction<reduction_op_max>(v0, ptr, size, stride);
    if (op_type == Reduction::ReductionOp_MIN) return reduction<reduction_op_min>(v0, ptr, size, stride);
    if (op_type == Reduction::ReductionOp_LogSumExp) return reduction<reduction_op_sumexp>(v0, ptr, size, stride);

    // should never reach here
    return v0;
}